

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleTransformNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  aiNode *paVar1;
  DataArrayList *pDVar2;
  runtime_error *prVar3;
  Value *this_00;
  long lVar4;
  float fVar5;
  undefined8 local_68;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  if (this->m_currentNode == (aiNode *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"No parent node for name.","");
    std::runtime_error::runtime_error(prVar3,(string *)&local_68);
    *(undefined ***)prVar3 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar2 = ODDLParser::DDLNode::getDataArrayList(node);
  if (pDVar2 == (DataArrayList *)0x0) {
    return;
  }
  if (pDVar2->m_numItems != 0x10) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid number of data for transform matrix.","");
    std::runtime_error::runtime_error(prVar3,(string *)&local_68);
    *(undefined ***)prVar3 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = this->m_currentNode;
  if (paVar1 != (aiNode *)0x0) {
    this_00 = pDVar2->m_dataList->m_next;
    local_68._0_4_ = ODDLParser::Value::getFloat(pDVar2->m_dataList);
    if (this_00 != (Value *)0x0) {
      lVar4 = 1;
      do {
        fVar5 = ODDLParser::Value::getFloat(this_00);
        *(float *)((long)&local_68 + lVar4 * 4) = fVar5;
        this_00 = this_00->m_next;
        lVar4 = lVar4 + 1;
      } while (this_00 != (Value *)0x0);
      if (lVar4 == 0x10) {
        (paVar1->mTransformation).a1 = (float)local_68;
        (paVar1->mTransformation).a2 = local_58;
        (paVar1->mTransformation).a3 = local_48;
        (paVar1->mTransformation).a4 = local_38;
        (paVar1->mTransformation).b1 = local_68._4_4_;
        (paVar1->mTransformation).b2 = local_54;
        (paVar1->mTransformation).b3 = local_44;
        (paVar1->mTransformation).b4 = local_34;
        (paVar1->mTransformation).c1 = local_60;
        (paVar1->mTransformation).c2 = local_50;
        (paVar1->mTransformation).c3 = local_40;
        (paVar1->mTransformation).c4 = local_30;
        (paVar1->mTransformation).d1 = local_5c;
        (paVar1->mTransformation).d2 = local_4c;
        (paVar1->mTransformation).d3 = local_3c;
        (paVar1->mTransformation).d4 = local_2c;
        return;
      }
    }
    __assert_fail("i == 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x293,"void Assimp::OpenGEX::setMatrix(aiNode *, DataArrayList *)");
  }
  __assert_fail("nullptr != node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                ,0x286,"void Assimp::OpenGEX::setMatrix(aiNode *, DataArrayList *)");
}

Assistant:

void OpenGEXImporter::handleTransformNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    DataArrayList *transformData( node->getDataArrayList() );
    if( nullptr != transformData ) {
        if( transformData->m_numItems != 16 ) {
            throw DeadlyImportError( "Invalid number of data for transform matrix." );
            return;
        }
        setMatrix( m_currentNode, transformData );
    }
}